

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O1

_Bool trans_fcvt_s_w(DisasContext_conflict12 *ctx,arg_fcvt_s_w *a)

{
  TCGContext_conflict11 *s;
  TCGTemp *pTVar1;
  uintptr_t o;
  TCGv_i64 a2;
  TCGOpcode opc;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (ctx->mstatus_fs == 0) {
    return false;
  }
  if ((ctx->misa & 0x20) == 0) {
    return false;
  }
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == (TCGv_i64)((long)pTVar1 - (long)s)) goto LAB_00c7d721;
    a2 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[a->rs1]);
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)pTVar1,(TCGArg)a2);
LAB_00c7d721:
  gen_set_rm(ctx,a->rm);
  local_38 = (TCGTemp *)(s->cpu_env + (long)s);
  pTVar1 = (TCGTemp *)((TCGv_i64)((long)pTVar1 - (long)s) + (long)s);
  local_30 = pTVar1;
  tcg_gen_callN_riscv64
            (s,helper_fcvt_s_w_riscv64,(TCGTemp *)((long)&s->pool_cur + (long)s->cpu_fpr[a->rd]),2,
             &local_38);
  mark_fs_dirty(ctx);
  tcg_temp_free_internal_riscv64(s,pTVar1);
  return true;
}

Assistant:

static bool trans_fcvt_s_w(DisasContext *ctx, arg_fcvt_s_w *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);

    gen_set_rm(ctx, a->rm);
    gen_helper_fcvt_s_w(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_env, t0);

    mark_fs_dirty(ctx);
    tcg_temp_free(tcg_ctx, t0);

    return true;
}